

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsTTDMoveToTopLevelEvent
          (JsRuntimeHandle runtimeHandle,JsTTDMoveMode moveMode,int64_t snapshotTime,
          int64_t eventTime)

{
  EventLog *this;
  bool bVar1;
  JsrtRuntime *this_00;
  ThreadContext *this_01;
  JsErrorCode inflateStatus;
  JsErrorCode res;
  EventLog *elog;
  ThreadContext *threadContext;
  JsrtRuntime *runtime;
  int64_t eventTime_local;
  int64_t snapshotTime_local;
  JsTTDMoveMode moveMode_local;
  JsRuntimeHandle runtimeHandle_local;
  
  this_00 = JsrtRuntime::FromHandle(runtimeHandle);
  this_01 = JsrtRuntime::GetThreadContext(this_00);
  bVar1 = ThreadContext::IsRuntimeInTTDMode(this_01);
  if (bVar1) {
    this = this_01->TTDLog;
    runtimeHandle_local._4_4_ = TTDHandleBreakpointInfoAndInflate(snapshotTime,this_00,this_01);
    if (runtimeHandle_local._4_4_ == JsNoError) {
      TTD::EventLog::PushMode(this,DebuggerSuppressBreakpoints);
      TTD::EventLog::ReplayRootEventsToTime(this,eventTime);
      TTD::EventLog::DoRtrSnapIfNeeded(this);
      TTD::EventLog::PopMode(this,DebuggerSuppressBreakpoints);
      runtimeHandle_local._4_4_ = JsNoError;
    }
    return runtimeHandle_local._4_4_;
  }
  TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
}

Assistant:

CHAKRA_API JsTTDMoveToTopLevelEvent(_In_ JsRuntimeHandle runtimeHandle, _In_ JsTTDMoveMode moveMode, _In_ int64_t snapshotTime, _In_ int64_t eventTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else

    JsrtRuntime* runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext* threadContext = runtime->GetThreadContext();
    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

    TTD::EventLog* elog = threadContext->TTDLog;
    JsErrorCode res = JsNoError;

    JsErrorCode inflateStatus = TTDHandleBreakpointInfoAndInflate(snapshotTime, runtime, threadContext);
    if(inflateStatus != JsNoError)
    {
        return inflateStatus;
    }

    elog->PushMode(TTD::TTDMode::DebuggerSuppressBreakpoints);
    try
    {
        elog->ReplayRootEventsToTime(eventTime);

        elog->DoRtrSnapIfNeeded();
    }
    catch(...) //we are replaying something that should be known to execute successfully so encountering any error is very bad
    {
        res = JsErrorFatal;
        TTDAssert(false, "Unexpected fatal Error");
    }
    elog->PopMode(TTD::TTDMode::DebuggerSuppressBreakpoints);

    return res;
#endif
}